

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

uint rlLoadTextureDepth(int width,int height,_Bool useRenderBuffer)

{
  ulong uVar1;
  uint id;
  
  id = 0;
  if (RLGL.ExtSupported.texDepth && !useRenderBuffer) {
    (*glad_glGenTextures)(1,&id);
    (*glad_glBindTexture)(0xde1,id);
    (*glad_glTexImage2D)(0xde1,0,0x1902,width,height,0,0x1902,0x1405,(void *)0x0);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
    (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
    (*glad_glBindTexture)(0xde1,0);
    TraceLog(3,"TEXTURE: Depth texture loaded successfully");
  }
  else {
    (*glad_glGenRenderbuffers)(1,&id);
    (*glad_glBindRenderbuffer)(0x8d41,id);
    (*glad_glRenderbufferStorage)(0x8d41,0x1902,width,height);
    (*glad_glBindRenderbuffer)(0x8d41,0);
    uVar1 = 0x10;
    if (0x17 < RLGL.ExtSupported.maxDepthBits) {
      uVar1 = (ulong)(uint)RLGL.ExtSupported.maxDepthBits;
    }
    TraceLog(3,"TEXTURE: [ID %i] Depth renderbuffer loaded successfully (%i bits)",(ulong)id,uVar1);
  }
  return id;
}

Assistant:

unsigned int rlLoadTextureDepth(int width, int height, bool useRenderBuffer)
{
    unsigned int id = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // In case depth textures not supported, we force renderbuffer usage
    if (!RLGL.ExtSupported.texDepth) useRenderBuffer = true;

    // NOTE: We let the implementation to choose the best bit-depth
    // Possible formats: GL_DEPTH_COMPONENT16, GL_DEPTH_COMPONENT24, GL_DEPTH_COMPONENT32 and GL_DEPTH_COMPONENT32F
    unsigned int glInternalFormat = GL_DEPTH_COMPONENT;

#if (defined(GRAPHICS_API_OPENGL_ES2) || defined(GRAPHICS_API_OPENGL_ES3))
    // WARNING: WebGL platform requires unsized internal format definition (GL_DEPTH_COMPONENT)
    // while other platforms using OpenGL ES 2.0 require/support sized internal formats depending on the GPU capabilities
    if (!RLGL.ExtSupported.texDepthWebGL || useRenderBuffer)
    {
        if (RLGL.ExtSupported.maxDepthBits == 32) glInternalFormat = GL_DEPTH_COMPONENT32_OES;
        else if (RLGL.ExtSupported.maxDepthBits == 24) glInternalFormat = GL_DEPTH_COMPONENT24_OES;
        else glInternalFormat = GL_DEPTH_COMPONENT16;
    }
#endif

    if (!useRenderBuffer && RLGL.ExtSupported.texDepth)
    {
        glGenTextures(1, &id);
        glBindTexture(GL_TEXTURE_2D, id);
        glTexImage2D(GL_TEXTURE_2D, 0, glInternalFormat, width, height, 0, GL_DEPTH_COMPONENT, GL_UNSIGNED_INT, NULL);

        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

        glBindTexture(GL_TEXTURE_2D, 0);

        TRACELOG(RL_LOG_INFO, "TEXTURE: Depth texture loaded successfully");
    }
    else
    {
        // Create the renderbuffer that will serve as the depth attachment for the framebuffer
        // NOTE: A renderbuffer is simpler than a texture and could offer better performance on embedded devices
        glGenRenderbuffers(1, &id);
        glBindRenderbuffer(GL_RENDERBUFFER, id);
        glRenderbufferStorage(GL_RENDERBUFFER, glInternalFormat, width, height);

        glBindRenderbuffer(GL_RENDERBUFFER, 0);

        TRACELOG(RL_LOG_INFO, "TEXTURE: [ID %i] Depth renderbuffer loaded successfully (%i bits)", id, (RLGL.ExtSupported.maxDepthBits >= 24)? RLGL.ExtSupported.maxDepthBits : 16);
    }
#endif

    return id;
}